

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::executeInstruction(VM *this,Instruction *ins)

{
  int in_EDX;
  Instruction *ins_local;
  VM *this_local;
  
  switch(ins->op) {
  case nop:
    break;
  case bipush:
  case ipush:
    ipush(this,ins->x);
    break;
  case pop:
    popn(this,1);
    break;
  case pop2:
    popn(this,2);
    break;
  case popn:
    popn(this,ins->x);
    break;
  case dup:
    dup(this,(int)ins);
    break;
  case dup2:
    dup2(this,(int)ins,in_EDX);
    break;
  case loadc:
    loadc(this,(u2)ins->x);
    break;
  case loada:
    loada(this,(u2)ins->x,ins->y);
    break;
  case _new:
    _new(this);
    break;
  case snew:
    snew(this,ins->x);
    break;
  case iload:
    Tload<int>(this);
    break;
  case dload:
    Tload<double>(this);
    break;
  case aload:
    Tload<int>(this);
    break;
  case iaload:
    Taload<int>(this);
    break;
  case daload:
    Taload<double>(this);
    break;
  case aaload:
    Taload<int>(this);
    break;
  case istore:
    Tstore<int>(this);
    break;
  case dstore:
    Tstore<double>(this);
    break;
  case astore:
    Tstore<int>(this);
    break;
  case iastore:
    Tastore<int>(this);
    break;
  case dastore:
    Tastore<double>(this);
    break;
  case aastore:
    Tastore<int>(this);
    break;
  case iadd:
    Tadd<int>(this);
    break;
  case dadd:
    Tadd<double>(this);
    break;
  case isub:
    Tsub<int>(this);
    break;
  case dsub:
    Tsub<double>(this);
    break;
  case imul:
    Tmul<int>(this);
    break;
  case dmul:
    Tmul<double>(this);
    break;
  case idiv:
    Tdiv<int>(this);
    break;
  case ddiv:
    Tdiv<double>(this);
    break;
  case ineg:
    Tneg<int>(this);
    break;
  case dneg:
    Tneg<double>(this);
    break;
  case icmp:
    Tcmp<int>(this);
    break;
  case dcmp:
    Tcmp<double>(this);
    break;
  case i2d:
    T2T<int,double>(this);
    break;
  case d2i:
    T2T<double,int>(this);
    break;
  case i2c:
    T2T<int,unsigned_char>(this);
    break;
  case jmp:
    jmp(this,(u2)ins->x);
    break;
  case je:
    je(this,(u2)ins->x);
    break;
  case jne:
    jne(this,(u2)ins->x);
    break;
  case jl:
    jl(this,(u2)ins->x);
    break;
  case jge:
    jge(this,(u2)ins->x);
    break;
  case jg:
    jg(this,(u2)ins->x);
    break;
  case jle:
    jle(this,(u2)ins->x);
    break;
  case call:
    call(this,(u2)ins->x);
    break;
  default:
    break;
  case ret:
    Tret<void>(this);
    break;
  case iret:
    Tret<int>(this);
    break;
  case dret:
    Tret<double>(this);
    break;
  case aret:
    Tret<int>(this);
    break;
  case iprint:
    Tprint<int>(this);
    break;
  case dprint:
    Tprint<double>(this);
    break;
  case cprint:
    Tprint<unsigned_char>(this);
    break;
  case sprint:
    sprint(this);
    break;
  case printl:
    printl(this);
    break;
  case iscan:
    Tscan<int>(this);
    break;
  case dscan:
    Tscan<double>(this);
    break;
  case cscan:
    Tscan<unsigned_char>(this);
  }
  return;
}

Assistant:

void VM::executeInstruction(const Instruction& ins) {
    //println(std::cout, "execute", ins);
    switch (ins.op)
    {
    case OpCode::nop: break;
    case OpCode::bipush:
    case OpCode::ipush:   ipush(ins.x); break;
    case OpCode::pop:     popn(1);      break;
    case OpCode::pop2:    popn(2);      break;
    case OpCode::popn:    popn(ins.x);  break;
    case OpCode::dup:     dup();        break;
    case OpCode::dup2:    dup2();       break;
    case OpCode::loadc:   loadc(ins.x); break;
    case OpCode::loada:   loada(ins.x, ins.y);break;
    case OpCode::_new:    _new();       break;
    case OpCode::snew:    snew(ins.x);  break;
    
    case OpCode::iload:   Tload<int_t>();      break;
    case OpCode::dload:   Tload<double_t>();   break;
    case OpCode::aload:   Tload<addr_t>();     break;
    case OpCode::iaload:  Taload<int_t>();     break;
    case OpCode::daload:  Taload<double_t>();  break;
    case OpCode::aaload:  Taload<addr_t>();    break;
    
    case OpCode::istore:  Tstore<int_t>();     break;
    case OpCode::dstore:  Tstore<double_t>();  break;
    case OpCode::astore:  Tstore<addr_t>();    break;
    case OpCode::iastore: Tastore<int_t>();    break;
    case OpCode::dastore: Tastore<double_t>(); break;
    case OpCode::aastore: Tastore<addr_t>();   break;
    
    case OpCode::iadd:    Tadd<int_t>();       break;
    case OpCode::dadd:    Tadd<double_t>();    break;
    case OpCode::isub:    Tsub<int_t>();       break;
    case OpCode::dsub:    Tsub<double_t>();    break;
    case OpCode::imul:    Tmul<int_t>();       break;
    case OpCode::dmul:    Tmul<double_t>();    break;
    case OpCode::idiv:    Tdiv<int_t>();       break;
    case OpCode::ddiv:    Tdiv<double_t>();    break;
    case OpCode::ineg:    Tneg<int_t>();       break;
    case OpCode::dneg:    Tneg<double_t>();    break;

    case OpCode::icmp:    Tcmp<int_t>();       break;
    case OpCode::dcmp:    Tcmp<double_t>();    break;
    
    case OpCode::i2d:     T2T<int_t, double_t>(); break;
    case OpCode::d2i:     T2T<double_t, int_t>(); break;
    case OpCode::i2c:     T2T<int_t, char_t>();   break;
    
    case OpCode::jmp:     jmp(ins.x);   break;
    case OpCode::je:      je(ins.x);    break;
    case OpCode::jne:     jne(ins.x);   break;
    case OpCode::jl:      jl(ins.x);    break;
    case OpCode::jge:     jge(ins.x);   break;
    case OpCode::jg:      jg(ins.x);    break;
    case OpCode::jle:     jle(ins.x);   break;

    case OpCode::call:    call(ins.x);      break;
    case OpCode::ret:     Tret<void>();     break;
    case OpCode::iret:    Tret<int_t>();    break;
    case OpCode::dret:    Tret<double_t>(); break;
    case OpCode::aret:    Tret<addr_t>();   break;

    case OpCode::iprint:  Tprint<int_t>();    break;
    case OpCode::dprint:  Tprint<double_t>(); break;
    case OpCode::cprint:  Tprint<char_t>();   break;
    case OpCode::sprint:  sprint();           break;
    case OpCode::printl:  printl();           break;
    case OpCode::iscan:   Tscan<int_t>();     break;
    case OpCode::dscan:   Tscan<double_t>();  break;
    case OpCode::cscan:   Tscan<char_t>();    break;
    default:
        break;
    }
}